

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parser.cpp
# Opt level: O1

MPP_RET mpp_parser_init(Parser *prs,ParserCfg *cfg)

{
  MppCodingType MVar1;
  MppCodingType MVar2;
  long lVar3;
  uint uVar4;
  long *ptr;
  void *ptr_00;
  MPP_RET MVar5;
  undefined8 in_RCX;
  ulong uVar6;
  long lVar7;
  
  uVar6 = CONCAT71((int7)((ulong)in_RCX >> 8),cfg != (ParserCfg *)0x0);
  if (prs != (Parser *)0x0 && cfg != (ParserCfg *)0x0) {
    *prs = (Parser)0x0;
    lVar7 = 0;
    do {
      lVar3 = *(long *)((long)parsers + lVar7);
      MVar1 = cfg->coding;
      MVar2 = *(MppCodingType *)(lVar3 + 8);
      if (MVar1 == MVar2) {
        ptr = (long *)mpp_osal_calloc("mpp_parser_init",0x10);
        ptr_00 = mpp_osal_calloc("mpp_parser_init",(ulong)*(uint *)(lVar3 + 0xc));
        if (ptr == (long *)0x0 || ptr_00 == (void *)0x0) {
          _mpp_log_l(2,"mpp_dec","failed to alloc parser context\n","mpp_parser_init");
          mpp_osal_free("mpp_parser_init",ptr);
          mpp_osal_free("mpp_parser_init",ptr_00);
          uVar6 = 0xfffffffc;
        }
        else {
          uVar4 = (**(code **)(lVar3 + 0x18))(ptr_00,cfg);
          if (uVar4 == 0) {
            *ptr = lVar3;
            ptr[1] = (long)ptr_00;
            *prs = ptr;
            uVar6 = 0;
          }
          else {
            uVar6 = (ulong)uVar4;
            _mpp_log_l(2,"mpp_dec","failed to init parser\n","mpp_parser_init");
            mpp_osal_free("mpp_parser_init",ptr);
            mpp_osal_free("mpp_parser_init",ptr_00);
          }
        }
      }
      if (MVar1 == MVar2) {
        return (MPP_RET)uVar6;
      }
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x68);
    MVar5 = MPP_NOK;
  }
  else {
    _mpp_log_l(2,"mpp_dec","found NULL input parser %p config %p\n","mpp_parser_init");
    MVar5 = MPP_ERR_NULL_PTR;
  }
  return MVar5;
}

Assistant:

MPP_RET mpp_parser_init(Parser *prs, ParserCfg *cfg)
{
    if (NULL == prs || NULL == cfg) {
        mpp_err_f("found NULL input parser %p config %p\n", prs, cfg);
        return MPP_ERR_NULL_PTR;
    }

    *prs = NULL;

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(parsers); i++) {
        const ParserApi *api = parsers[i];
        if (cfg->coding == api->coding) {
            ParserImpl *p = mpp_calloc(ParserImpl, 1);
            void *ctx = mpp_calloc_size(void, api->ctx_size);
            if (NULL == ctx || NULL == p) {
                mpp_err_f("failed to alloc parser context\n");
                mpp_free(p);
                mpp_free(ctx);
                return MPP_ERR_MALLOC;
            }

            MPP_RET ret = api->init(ctx, cfg);
            if (MPP_OK != ret) {
                mpp_err_f("failed to init parser\n");
                mpp_free(p);
                mpp_free(ctx);
                return ret;
            }

            p->api  = api;
            p->ctx  = ctx;
            *prs = p;
            return MPP_OK;
        }
    }
    return MPP_NOK;
}